

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementsTable.cpp
# Opt level: O3

void __thiscall OpenMD::ElementsTable::ParseLine(ElementsTable *this,char *buffer)

{
  pointer *pppEVar1;
  iterator __position;
  Element *this_00;
  size_t sVar2;
  int maxbonds;
  int num;
  char symbol [4];
  Element *ele;
  RealType blue;
  RealType green;
  RealType red;
  RealType elAffin;
  RealType ARENeg;
  RealType mass;
  RealType Rvdw;
  RealType Rcov;
  string local_168;
  RealType ionize;
  RealType elNeg;
  char name [256];
  
  if (*buffer != '#') {
    __isoc99_sscanf(buffer,"%d %3s %lf %lf %*f %lf %d %lf %lf %lf %lf %lf %lf %lf %255s",&num,symbol
                    ,&ARENeg,&Rcov,&Rvdw,&maxbonds,&mass,&elNeg,&ionize,&elAffin,&red,&green,&blue,
                    name);
    this_00 = (Element *)operator_new(0xa0);
    local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
    sVar2 = strlen(name);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,name,name + sVar2);
    Element::Element(this_00,num,symbol,ARENeg,Rcov,Rvdw,maxbonds,mass,elNeg,ionize,elAffin,red,
                     green,blue,&local_168);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p != &local_168.field_2) {
      operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
    }
    __position._M_current =
         (this->elements_).super__Vector_base<OpenMD::Element_*,_std::allocator<OpenMD::Element_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->elements_).super__Vector_base<OpenMD::Element_*,_std::allocator<OpenMD::Element_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      ele = this_00;
      std::vector<OpenMD::Element*,std::allocator<OpenMD::Element*>>::
      _M_realloc_insert<OpenMD::Element*const&>
                ((vector<OpenMD::Element*,std::allocator<OpenMD::Element*>> *)&this->elements_,
                 __position,&ele);
    }
    else {
      *__position._M_current = this_00;
      pppEVar1 = &(this->elements_).
                  super__Vector_base<OpenMD::Element_*,_std::allocator<OpenMD::Element_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppEVar1 = *pppEVar1 + 1;
    }
  }
  return;
}

Assistant:

void ElementsTable::ParseLine(const char* buffer) {
    int num, maxbonds;
    char symbol[4];
    char name[256];
    RealType Rcov, Rvdw, mass, elNeg, ARENeg, ionize, elAffin;
    RealType red, green, blue;

    // skip comment line (at the top)
    if (buffer[0] != '#') {
      sscanf(buffer,
             "%d %3s %lf %lf %*f %lf %d %lf %lf %lf %lf %lf %lf %lf %255s",
             &num, symbol, &ARENeg, &Rcov, &Rvdw, &maxbonds, &mass, &elNeg,
             &ionize, &elAffin, &red, &green, &blue, name);

      Element* ele =
          new Element(num, symbol, ARENeg, Rcov, Rvdw, maxbonds, mass, elNeg,
                      ionize, elAffin, red, green, blue, name);
      elements_.push_back(ele);
    }
  }